

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::bucket_count(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *this)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  size_t sVar2;
  long lVar3;
  
  sVar2 = 0;
  lVar3 = 0;
  do {
    __mutex = (pthread_mutex_t *)
              ((long)&(this->sets_)._M_elems[0].super_Lockable.super_mutex.super___mutex_base.
                      _M_mutex + lVar3);
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    sVar2 = sVar2 + *(long *)((long)&(this->sets_)._M_elems[0].set_.capacity_ + lVar3);
    pthread_mutex_unlock(__mutex);
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x700);
  return sVar2;
}

Assistant:

size_t bucket_count() const {
        size_t sz = 0;
        for (const auto& inner : sets_)
        {
            SharedLock m(const_cast<Inner&>(inner));
            sz += inner.set_.bucket_count();
        }
        return sz; 
    }